

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

bool __thiscall Bipartition::contains(Bipartition *this,Bipartition *e)

{
  byte bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> foreign;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_RDI,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar1 = boost::operator==(in_RDI,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(in_RDI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Bipartition::contains(const Bipartition& e) const {
    auto foreign = e.partition;
    foreign &= partition;
    return foreign == e.partition;
}